

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void ym2610_alloc_pcmromb(void *chip,UINT32 memsize)

{
  void *__s;
  YM2610 *F2610;
  
  if (*(UINT32 *)((long)chip + 0x5390) == memsize) {
    return;
  }
  __s = realloc(*(void **)((long)chip + 0x5370),(ulong)memsize);
  *(void **)((long)chip + 0x5370) = __s;
  *(UINT32 *)((long)chip + 0x5390) = memsize;
  memset(__s,0xff,(ulong)memsize);
  YM_DELTAT_calc_mem_mask((YM_DELTAT *)((long)chip + 0x5368));
  return;
}

Assistant:

void ym2610_alloc_pcmromb(void* chip, UINT32 memsize)
{
	YM2610 *F2610 = (YM2610 *)chip;
	
	if (F2610->deltaT.memory_size == memsize)
		return;
	F2610->deltaT.memory = (UINT8*)realloc(F2610->deltaT.memory, memsize);
	F2610->deltaT.memory_size = memsize;
	memset(F2610->deltaT.memory, 0xFF, memsize);
	YM_DELTAT_calc_mem_mask(&F2610->deltaT);
	
	return;
}